

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

class_<MPL::ModelPackageItemInfo,_std::shared_ptr<MPL::ModelPackageItemInfo>_> * __thiscall
pybind11::class_<MPL::ModelPackageItemInfo,std::shared_ptr<MPL::ModelPackageItemInfo>>::
def<std::__cxx11::string_const&(MPL::ModelPackageItemInfo::*)()const>
          (class_<MPL::ModelPackageItemInfo,std::shared_ptr<MPL::ModelPackageItemInfo>> *this,
          char *name_,offset_in_ModelPackageItemInfo_to_subr *f)

{
  offset_in_ModelPackageItemInfo_to_subr f_00;
  name *extra;
  handle hVar1;
  handle hVar2;
  cpp_function cf;
  handle local_60;
  handle local_58;
  handle local_50;
  sibling local_48;
  is_method local_40;
  PyObject *local_38;
  
  f_00 = *f;
  extra = (name *)f[1];
  hVar1.m_ptr = *(PyObject **)this;
  local_50.m_ptr = (PyObject *)&_Py_NoneStruct;
  local_48.value.m_ptr = (handle)(handle)hVar1.m_ptr;
  local_40.class_.m_ptr = (handle)(handle)name_;
  handle::inc_ref(&local_50);
  hVar2.m_ptr = local_50.m_ptr;
  local_60.m_ptr = (PyObject *)PyObject_GetAttrString(hVar1.m_ptr,name_);
  if (local_60.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_60.m_ptr = hVar2.m_ptr;
    handle::inc_ref(&local_60);
  }
  local_38 = local_60.m_ptr;
  cpp_function::
  cpp_function<std::__cxx11::string_const&,MPL::ModelPackageItemInfo,,pybind11::name,pybind11::is_method,pybind11::sibling>
            ((cpp_function *)&local_58,f_00,extra,&local_40,&local_48);
  handle::dec_ref(&local_60);
  handle::dec_ref(&local_50);
  detail::add_class_method((object *)this,name_,(cpp_function *)&local_58);
  handle::dec_ref(&local_58);
  return (class_<MPL::ModelPackageItemInfo,_std::shared_ptr<MPL::ModelPackageItemInfo>_> *)this;
}

Assistant:

class_ &def(const char *name_, Func &&f, const Extra &...extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)),
                        name(name_),
                        is_method(*this),
                        sibling(getattr(*this, name_, none())),
                        extra...);
        add_class_method(*this, name_, cf);
        return *this;
    }